

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O0

int dwarf_get_arange(Dwarf_Arange *aranges,Dwarf_Unsigned arange_count,Dwarf_Addr address,
                    Dwarf_Arange *returned_arange,Dwarf_Error *error)

{
  Dwarf_Arange pDVar1;
  ulong local_48;
  Dwarf_Unsigned i;
  Dwarf_Arange curr_arange;
  Dwarf_Error *error_local;
  Dwarf_Arange *returned_arange_local;
  Dwarf_Addr address_local;
  Dwarf_Unsigned arange_count_local;
  Dwarf_Arange *aranges_local;
  
  if (aranges == (Dwarf_Arange *)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x8a);
    aranges_local._4_4_ = 1;
  }
  else {
    for (local_48 = 0; local_48 < arange_count; local_48 = local_48 + 1) {
      pDVar1 = aranges[local_48];
      if ((pDVar1->ar_address <= address) && (address < pDVar1->ar_address + pDVar1->ar_length)) {
        *returned_arange = pDVar1;
        return 0;
      }
    }
    aranges_local._4_4_ = -1;
  }
  return aranges_local._4_4_;
}

Assistant:

int
dwarf_get_arange(Dwarf_Arange * aranges,
    Dwarf_Unsigned arange_count,
    Dwarf_Addr address,
    Dwarf_Arange * returned_arange, Dwarf_Error * error)
{
    Dwarf_Arange curr_arange = 0;
    Dwarf_Unsigned i = 0;

    if (!aranges) {
        _dwarf_error(NULL, error, DW_DLE_ARANGES_NULL);
        return DW_DLV_ERROR;
    }
    for (i = 0; i < arange_count; i++) {
        curr_arange = *(aranges + i);
        if (address >= curr_arange->ar_address &&
            address <
            curr_arange->ar_address + curr_arange->ar_length) {
            *returned_arange = curr_arange;
            return DW_DLV_OK;
        }
    }
    return DW_DLV_NO_ENTRY;
}